

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script,ConfidentialNonce *nonce)

{
  uint32_t uVar1;
  ByteData local_60;
  ByteData local_48;
  
  ByteData::ByteData(&local_60);
  ByteData::ByteData(&local_48);
  uVar1 = AddTxOut(this,value,asset,locking_script,nonce,&local_60,&local_48);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script, const ConfidentialNonce &nonce) {
  return AddTxOut(value, asset, locking_script, nonce, ByteData(), ByteData());
}